

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int32_t __thiscall
aeron::archive::AeronArchive::listRecordingsForUri
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,string *channelFragment,
          int32_t streamId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  int64_t local_60;
  int32_t local_58;
  int32_t local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_60 = fromRecordingId;
  local_58 = streamId;
  local_54 = recordCount;
  local_50._M_unused._M_object = operator_new(0x28);
  *(AeronArchive **)local_50._M_unused._0_8_ = this;
  *(int64_t **)((long)local_50._M_unused._0_8_ + 8) = &local_60;
  *(int32_t **)((long)local_50._M_unused._0_8_ + 0x10) = &local_54;
  *(string **)((long)local_50._M_unused._0_8_ + 0x18) = channelFragment;
  *(int32_t **)((long)local_50._M_unused._0_8_ + 0x20) = &local_58;
  local_38 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:259:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:259:9)>
             ::_M_manager;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_50,recordCount,consumer,
                     "list recordings for URI");
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordingsForUri(std::int64_t fromRecordingId, std::int32_t recordCount,
                                                const std::string& channelFragment, std::int32_t streamId,
                                                RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return archiveProxy_->listRecordingsForUri(fromRecordingId, recordCount, channelFragment, streamId, correlationId,
                                                       controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings for URI");
}